

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_unk4c(envy_bios *bios)

{
  byte bVar1;
  uint offs;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_unk4c_entry *peVar5;
  ulong uVar6;
  
  offs = (bios->power).unk4c.offset;
  iVar2 = -0x16;
  if (offs != 0) {
    bios_u8(bios,offs,&(bios->power).unk4c.version);
    if ((bios->power).unk4c.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).unk4c.offset + 1,&(bios->power).unk4c.hlen);
      iVar3 = bios_u8(bios,(bios->power).unk4c.offset + 2,&(bios->power).unk4c.rlen);
      iVar4 = bios_u8(bios,(bios->power).unk4c.offset + 3,&(bios->power).unk4c.entriesnum);
      (bios->power).unk4c.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      bVar1 = (bios->power).unk4c.entriesnum;
      peVar5 = (envy_bios_power_unk4c_entry *)malloc((ulong)bVar1 << 2);
      (bios->power).unk4c.entries = peVar5;
      iVar2 = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        peVar5[uVar6].offset =
             (uint)(bios->power).unk4c.rlen * (int)uVar6 +
             (uint)(bios->power).unk4c.hlen + (bios->power).unk4c.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown THERMAL ADJUSTMENT table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_unk4c(struct envy_bios *bios) {
	struct envy_bios_power_unk4c *unk4c = &bios->power.unk4c;
	int i, err = 0;

	if (!unk4c->offset)
		return -EINVAL;

	bios_u8(bios, unk4c->offset + 0x0, &unk4c->version);
	switch(unk4c->version) {
	case 0x10:
		err |= bios_u8(bios, unk4c->offset + 0x1, &unk4c->hlen);
		err |= bios_u8(bios, unk4c->offset + 0x2, &unk4c->rlen);
		err |= bios_u8(bios, unk4c->offset + 0x3, &unk4c->entriesnum);
		unk4c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown THERMAL ADJUSTMENT table version 0x%x\n", unk4c->version);
		return -EINVAL;
	};

	err = 0;
	unk4c->entries = malloc(unk4c->entriesnum * sizeof(struct envy_bios_power_unk4c_entry));
	for (i = 0; i < unk4c->entriesnum; i++) {
		uint32_t data = unk4c->offset + unk4c->hlen + i * unk4c->rlen;

		unk4c->entries[i].offset = data;
	}

	return 0;
}